

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
operator()(arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,char_type *value)

{
  size_t in_RCX;
  void *in_RDX;
  cstring_spec_handler local_18;
  
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value,in_RDX,in_RCX);
  }
  else {
    local_18.formatter = this;
    local_18.value = value;
    handle_cstring_type_spec<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::cstring_spec_handler>
              ((this->specs_->super_core_format_specs).type,&local_18);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }